

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution3d.cpp
# Opt level: O0

void __thiscall ncnn::Convolution3D::Convolution3D(Convolution3D *this)

{
  undefined8 *in_RDI;
  Layer *in_stack_ffffffffffffffd0;
  
  Layer::Layer(in_stack_ffffffffffffffd0);
  *in_RDI = &PTR__Convolution3D_009bfc18;
  ncnn::Mat::Mat((Mat *)(in_RDI + 0x24));
  ncnn::Mat::Mat((Mat *)(in_RDI + 0x2d));
  ncnn::Mat::Mat((Mat *)(in_RDI + 0x36));
  *(undefined1 *)(in_RDI + 1) = 1;
  *(undefined1 *)((long)in_RDI + 9) = 0;
  return;
}

Assistant:

Convolution3D::Convolution3D()
{
    one_blob_only = true;
    support_inplace = false;
}